

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O1

void __thiscall ON_Object::PurgeUserData(ON_Object *this)

{
  ON_UserData *pOVar1;
  bool bVar2;
  ON_UserData *pOVar3;
  
  pOVar3 = this->m_userdata_list;
  if (pOVar3 != (ON_UserData *)0x0) {
    this->m_userdata_list = (ON_UserData *)0x0;
    bVar2 = g__bLeakUserData;
    do {
      pOVar1 = pOVar3->m_userdata_next;
      pOVar3->m_userdata_owner = (ON_Object *)0x0;
      pOVar3->m_userdata_next = (ON_UserData *)0x0;
      if (bVar2 == false) {
        (*(pOVar3->super_ON_Object)._vptr_ON_Object[4])();
      }
      pOVar3 = pOVar1;
    } while (pOVar1 != (ON_UserData *)0x0);
  }
  return;
}

Assistant:

void ON_Object::PurgeUserData()
{
  ON_UserData* p;
  ON_UserData* next;
  bool bDeleteUserData;
  if ( 0 != (next=m_userdata_list) ) 
  {
    m_userdata_list = 0;
    bDeleteUserData = !g__bLeakUserData;
    while( 0 != (p=next) ) 
    {
      next = p->m_userdata_next;
      p->m_userdata_owner = 0;
      p->m_userdata_next = 0;
      if ( bDeleteUserData )
        delete p;
    }
  }
}